

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmanonfn.h
# Opt level: O0

int __thiscall CVmObjAnonFn::is_of_metaclass(CVmObjAnonFn *this,CVmMetaclass *meta)

{
  int iVar1;
  CVmMetaclass *in_RSI;
  undefined7 in_stack_ffffffffffffffe8;
  bool bVar2;
  
  bVar2 = true;
  if (in_RSI != metaclass_reg_) {
    iVar1 = CVmObjVector::is_of_metaclass
                      ((CVmObjVector *)in_RSI,(CVmMetaclass *)CONCAT17(1,in_stack_ffffffffffffffe8))
    ;
    bVar2 = iVar1 != 0;
  }
  return (int)bVar2;
}

Assistant:

virtual int is_of_metaclass(class CVmMetaclass *meta) const
    {
        /* try my own metaclass and my base class */
        return (meta == metaclass_reg_
                || CVmObjVector::is_of_metaclass(meta));
    }